

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System.c
# Opt level: O2

char * kwsysSystem_Shell__SkipMakeVariables(char *c)

{
  char cVar1;
  ushort **ppuVar2;
  char *pcVar3;
  
LAB_00133e1b:
  pcVar3 = c;
  if (*pcVar3 != '$') {
    return pcVar3;
  }
  if (pcVar3[1] != '(') {
    return pcVar3;
  }
  c = pcVar3 + 3;
  do {
    cVar1 = c[-1];
    if (cVar1 != '_') {
      if (cVar1 == '\0') {
        return pcVar3;
      }
      ppuVar2 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar2 + (long)cVar1 * 2 + 1) & 4) == 0) break;
    }
    c = c + 1;
  } while( true );
  if (cVar1 != ')') {
    return pcVar3;
  }
  goto LAB_00133e1b;
}

Assistant:

static const char* kwsysSystem_Shell__SkipMakeVariables(const char* c)
{
  while(*c == '$' && *(c+1) == '(')
    {
    const char* skip = c+2;
    while(kwsysSystem_Shell__CharIsMakeVariableName(*skip))
      {
      ++skip;
      }
    if(*skip == ')')
      {
      c = skip+1;
      }
    else
      {
      break;
      }
    }
  return c;
}